

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

unsigned_long * __thiscall
google::protobuf::internal::UntypedMapBase::GetValue<unsigned_long>
          (UntypedMapBase *this,NodeBase *node)

{
  if ((byte)(this->type_info_).field_0x3 >> 4 == 2) {
    return (unsigned_long *)((long)&node->next + (ulong)(this->type_info_).value_offset);
  }
  GetValue<unsigned_long>();
}

Assistant:

T* GetValue(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.value_type));
    return reinterpret_cast<T*>(GetVoidValue(node));
  }